

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

ZSTD_frameSizeInfo *
ZSTD_findFrameSizeInfo(ZSTD_frameSizeInfo *__return_storage_ptr__,void *src,size_t srcSize)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long_long uVar6;
  void *src_00;
  BYTE *ipstart;
  bool bVar7;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  size_t local_78;
  blockProperties_t local_6c;
  ZSTD_frameHeader local_60;
  
  if ((7 < srcSize) && ((*src & 0xfffffff0) == 0x184d2a50)) {
    uVar2 = (ulong)*(uint *)((long)src + 4) + 8;
    uVar5 = 0xffffffffffffffb8;
    if (uVar2 <= srcSize) {
      uVar5 = uVar2;
    }
    uVar2 = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      uVar2 = uVar5;
    }
    if (uVar2 <= srcSize || 0xffffffffffffff88 < uVar2) {
      __return_storage_ptr__->nbBlocks = 0;
      __return_storage_ptr__->compressedSize = uVar2;
      __return_storage_ptr__->decompressedBound = 0;
      return __return_storage_ptr__;
    }
    __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x2e7,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
  }
  sVar3 = ZSTD_getFrameHeader_advanced(&local_60,src,srcSize,ZSTD_f_zstd1);
  uVar6 = 0xfffffffffffffffe;
  if ((sVar3 < 0xffffffffffffff89) && (bVar7 = sVar3 == 0, sVar3 = 0xffffffffffffffb8, bVar7)) {
    src_00 = (void *)((long)src + (ulong)local_60.headerSize);
    local_78 = 0;
    uVar5 = srcSize - local_60.headerSize;
    do {
      sVar3 = ZSTD_getcBlockSize(src_00,uVar5,&local_6c);
      if (sVar3 < 0xffffffffffffff89) {
        uVar4 = sVar3 + 3;
        uVar2 = uVar5 - uVar4;
        if (uVar5 < uVar4) {
          __return_storage_ptr__->compressedSize = 0xffffffffffffffb8;
          goto LAB_007cd6e9;
        }
        src_00 = (void *)((long)src_00 + uVar4);
        local_78 = local_78 + 1;
        cVar1 = (local_6c.lastBlock != 0) * '\x03';
      }
      else {
        __return_storage_ptr__->compressedSize = sVar3;
LAB_007cd6e9:
        __return_storage_ptr__->decompressedBound = 0xfffffffffffffffe;
        cVar1 = '\x01';
        uVar2 = uVar5;
      }
      uVar5 = uVar2;
    } while (cVar1 == '\0');
    if (cVar1 != '\x03') {
      return __return_storage_ptr__;
    }
    if (local_60.checksumFlag != 0) {
      sVar3 = 0xffffffffffffffb8;
      if (uVar2 < 4) goto LAB_007cd757;
      src_00 = (void *)((long)src_00 + 4);
    }
    sVar3 = (long)src_00 - (long)src;
    uVar6 = local_60.blockSizeMax * local_78;
    if (local_60.frameContentSize != 0xffffffffffffffff) {
      uVar6 = local_60.frameContentSize;
    }
    __return_storage_ptr__->nbBlocks = local_78;
  }
LAB_007cd757:
  __return_storage_ptr__->compressedSize = sVar3;
  __return_storage_ptr__->decompressedBound = uVar6;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.nbBlocks = nbBlocks;
        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : (unsigned long long)nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}